

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::InitProtobufDefaultsSlow(void)

{
  int iVar1;
  
  if (InitProtobufDefaultsSlow()::is_inited == '\0') {
    iVar1 = __cxa_guard_acquire(&InitProtobufDefaultsSlow()::is_inited);
    if (iVar1 != 0) {
      InitProtobufDefaultsSlow::is_inited = InitProtobufDefaultsImpl();
      __cxa_guard_release(&InitProtobufDefaultsSlow()::is_inited);
    }
  }
  return;
}

Assistant:

void InitProtobufDefaultsSlow() {
  static bool is_inited = InitProtobufDefaultsImpl();
  (void)is_inited;
}